

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O0

void tcu::parseCaseList(CaseTreeNode *root,istream *in)

{
  bool bVar1;
  int iVar2;
  int_type iVar3;
  reference ppCVar4;
  ulong uVar5;
  invalid_argument *piVar6;
  CaseTreeNode *this;
  size_type sVar7;
  string *__lhs;
  CaseTreeNode *local_90;
  CaseTreeNode *curGroup;
  int local_7c;
  CaseTreeNode *pCStack_78;
  int nextChr;
  CaseTreeNode *newChild;
  int curChr;
  value_type local_60;
  undefined1 local_58 [8];
  string curName;
  undefined1 local_30 [4];
  int stackPos;
  vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_> nodeStack;
  istream *in_local;
  CaseTreeNode *root_local;
  
  nodeStack.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in;
  std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::vector
            ((vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_> *)local_30);
  curName.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)local_58);
  local_60 = (value_type)0x0;
  std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::resize
            ((vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_> *)local_30,8,
             &local_60);
  ppCVar4 = std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::operator[]
                      ((vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_> *)local_30
                       ,0);
  *ppCVar4 = root;
  do {
    while( true ) {
      while( true ) {
        iVar2 = std::istream::get();
        newChild._0_4_ = iVar2;
        iVar3 = std::char_traits<char>::eof();
        if ((((iVar2 != iVar3) && ((int)newChild != 0)) && ((int)newChild != 10)) &&
           ((int)newChild != 0xd)) break;
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) != 0) {
          piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar6,"Empty test case name");
          __cxa_throw(piVar6,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        ppCVar4 = std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::operator[]
                            ((vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_> *)
                             local_30,(long)(int)curName.field_2._12_4_);
        bVar1 = CaseTreeNode::hasChild(*ppCVar4,(string *)local_58);
        if (bVar1) {
          piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar6,"Duplicate test case");
          __cxa_throw(piVar6,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        this = (CaseTreeNode *)operator_new(0x38);
        CaseTreeNode::CaseTreeNode(this,(string *)local_58);
        pCStack_78 = this;
        ppCVar4 = std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::operator[]
                            ((vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_> *)
                             local_30,(long)(int)curName.field_2._12_4_);
        CaseTreeNode::addChild(*ppCVar4,pCStack_78);
        std::__cxx11::string::clear();
        curName.field_2._12_4_ = 0;
        if (((int)newChild == 0xd) && (iVar2 = std::istream::peek(), iVar2 == 10)) {
          std::istream::get();
        }
        iVar2 = std::istream::peek();
        local_7c = iVar2;
        iVar3 = std::char_traits<char>::eof();
        if ((iVar2 == iVar3) || (local_7c == 0)) {
          std::__cxx11::string::~string((string *)local_58);
          std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::~vector
                    ((vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_> *)local_30);
          return;
        }
      }
      if ((int)newChild == 0x2e) break;
      bVar1 = isValidTestCaseNameChar((char)newChild);
      if (!bVar1) {
        piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar6,"Illegal character in test case name");
        __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      std::__cxx11::string::operator+=((string *)local_58,(char)newChild);
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar6,"Empty test group name");
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    sVar7 = std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::size
                      ((vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_> *)local_30
                      );
    if ((int)sVar7 <= curName.field_2._12_4_ + 1) {
      sVar7 = std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::size
                        ((vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_> *)
                         local_30);
      curGroup = (CaseTreeNode *)0x0;
      std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::resize
                ((vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_> *)local_30,
                 sVar7 * 2,&curGroup);
    }
    ppCVar4 = std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::operator[]
                        ((vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_> *)
                         local_30,(long)(curName.field_2._12_4_ + 1));
    if (*ppCVar4 == (value_type)0x0) {
LAB_00a0e17d:
      ppCVar4 = std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::operator[]
                          ((vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_> *)
                           local_30,(long)(int)curName.field_2._12_4_);
      local_90 = CaseTreeNode::getChild(*ppCVar4,(string *)local_58);
      if (local_90 == (CaseTreeNode *)0x0) {
        local_90 = (CaseTreeNode *)operator_new(0x38);
        CaseTreeNode::CaseTreeNode(local_90,(string *)local_58);
        ppCVar4 = std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::operator[]
                            ((vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_> *)
                             local_30,(long)(int)curName.field_2._12_4_);
        CaseTreeNode::addChild(*ppCVar4,local_90);
      }
      ppCVar4 = std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::operator[]
                          ((vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_> *)
                           local_30,(long)(curName.field_2._12_4_ + 1));
      *ppCVar4 = local_90;
      sVar7 = std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::size
                        ((vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_> *)
                         local_30);
      if (curName.field_2._12_4_ + 2 < (int)sVar7) {
        ppCVar4 = std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::operator[]
                            ((vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_> *)
                             local_30,(long)(curName.field_2._12_4_ + 2));
        *ppCVar4 = (value_type)0x0;
      }
    }
    else {
      ppCVar4 = std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::operator[]
                          ((vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_> *)
                           local_30,(long)(curName.field_2._12_4_ + 1));
      __lhs = CaseTreeNode::getName_abi_cxx11_(*ppCVar4);
      bVar1 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_58);
      if (bVar1) goto LAB_00a0e17d;
    }
    std::__cxx11::string::clear();
    curName.field_2._12_4_ = curName.field_2._12_4_ + 1;
  } while( true );
}

Assistant:

static void parseCaseList (CaseTreeNode* root, std::istream& in)
{
	// \note Algorithm assumes that cases are sorted by groups, but will
	//		 function fine, albeit more slowly, if that is not the case.
	vector<CaseTreeNode*>	nodeStack;
	int						stackPos	= 0;
	string					curName;

	nodeStack.resize(8, DE_NULL);

	nodeStack[0] = root;

	for (;;)
	{
		const int	curChr	= in.get();

		if (curChr == std::char_traits<char>::eof() || curChr == 0 || curChr == '\n' || curChr == '\r')
		{
			if (curName.empty())
				throw std::invalid_argument("Empty test case name");

			if (nodeStack[stackPos]->hasChild(curName))
				throw std::invalid_argument("Duplicate test case");

			CaseTreeNode* const newChild = new CaseTreeNode(curName);

			try
			{
				nodeStack[stackPos]->addChild(newChild);
			}
			catch (...)
			{
				delete newChild;
				throw;
			}

			curName.clear();
			stackPos = 0;

			if (curChr == '\r' && in.peek() == '\n')
				in.get();

			{
				const int nextChr = in.peek();

				if (nextChr == std::char_traits<char>::eof() || nextChr == 0)
					break;
			}
		}
		else if (curChr == '.')
		{
			if (curName.empty())
				throw std::invalid_argument("Empty test group name");

			if ((int)nodeStack.size() <= stackPos+1)
				nodeStack.resize(nodeStack.size()*2, DE_NULL);

			if (!nodeStack[stackPos+1] || nodeStack[stackPos+1]->getName() != curName)
			{
				CaseTreeNode* curGroup = nodeStack[stackPos]->getChild(curName);

				if (!curGroup)
				{
					curGroup = new CaseTreeNode(curName);

					try
					{
						nodeStack[stackPos]->addChild(curGroup);
					}
					catch (...)
					{
						delete curGroup;
						throw;
					}
				}

				nodeStack[stackPos+1] = curGroup;

				if ((int)nodeStack.size() > stackPos+2)
					nodeStack[stackPos+2] = DE_NULL; // Invalidate rest of entries
			}

			DE_ASSERT(nodeStack[stackPos+1]->getName() == curName);

			curName.clear();
			stackPos += 1;
		}
		else if (isValidTestCaseNameChar((char)curChr))
			curName += (char)curChr;
		else
			throw std::invalid_argument("Illegal character in test case name");
	}
}